

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O0

int ON_Intersect(ON_Plane *plane,ON_Circle *circle,ON_3dPoint *point0,ON_3dPoint *point1)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  ON_Plane *S;
  ON_3dPoint *pOVar4;
  double d;
  bool rc;
  double b;
  double a;
  ON_Line xline;
  int rval;
  ON_3dPoint *point1_local;
  ON_3dPoint *point0_local;
  ON_Circle *circle_local;
  ON_Plane *plane_local;
  
  xline.to.z._4_4_ = 0xffffffff;
  ON_Line::ON_Line((ON_Line *)&a);
  S = ON_Circle::Plane(circle);
  bVar3 = ON_Intersect(plane,S,(ON_Line *)&a);
  if (bVar3) {
    xline.to.z._4_4_ =
         ON_Intersect((ON_Line *)&a,circle,&b,point0,(double *)&stack0xffffffffffffff90,point1);
  }
  else {
    pOVar4 = ON_Circle::Center(circle);
    dVar1 = ON_PlaneEquation::ValueAt(&plane->plane_equation,*pOVar4);
    if (2.3283064365386963e-10 <= dVar1) {
      xline.to.z._4_4_ = 0;
    }
    else {
      xline.to.z._4_4_ = 3;
    }
  }
  iVar2 = xline.to.z._4_4_;
  ON_Line::~ON_Line((ON_Line *)&a);
  return iVar2;
}

Assistant:

int ON_Intersect(
  const ON_Plane& plane,
  const ON_Circle& circle,
  ON_3dPoint& point0,
  ON_3dPoint& point1
                  )
{
  int rval = -1;
  ON_Line xline;
	double a,b;
  bool rc = ON_Intersect(plane, circle.Plane(), xline);
	if(rc)
  {
    rval = ON_Intersect(xline, circle, &a, point0, &b, point1);
  }
  else
  {
		double d = plane.plane_equation.ValueAt( circle.Center() );
		if(d<ON_ZERO_TOLERANCE)
			rval =3;
    else
      rval = 0;
  }
  return rval;
}